

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpt.cpp
# Opt level: O0

bool pg::au(int *dst,int *src,int d,int k,int max,int maxopp,int pl)

{
  long lVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int k_00;
  int *b;
  bool bVar5;
  undefined8 uStack_70;
  int aiStack_68 [2];
  int *local_60;
  int local_54;
  int local_50;
  int i_1;
  int i;
  unsigned_long __vla_expr0;
  int local_34;
  int local_30;
  int j;
  int maxopp_local;
  int max_local;
  int k_local;
  int d_local;
  int *src_local;
  int *dst_local;
  
  uStack_70 = 0x220538;
  local_30 = maxopp;
  j = max;
  maxopp_local = k;
  max_local = d;
  _k_local = src;
  src_local = dst;
  local_34 = up(dst,src,d,k,pl);
  piVar2 = _k_local;
  k_00 = maxopp_local;
  iVar4 = j;
  iVar3 = local_30;
  if (local_34 == -1) {
    dst_local._7_1_ = false;
  }
  else {
    _i = (ulong)(uint)maxopp_local;
    lVar1 = -(_i * 4 + 0xf & 0xfffffffffffffff0);
    local_60 = (int *)((long)aiStack_68 + lVar1);
    __vla_expr0 = (unsigned_long)aiStack_68;
    *(undefined8 *)((long)aiStack_68 + lVar1 + -8) = 0x220588;
    bVar5 = bump((int *)((long)aiStack_68 + lVar1),piVar2,k_00,iVar4,iVar3,pl);
    iVar4 = max_local;
    iVar3 = maxopp_local;
    piVar2 = local_60;
    if (bVar5) {
      *(undefined8 *)((long)aiStack_68 + lVar1 + -8) = 0x2205b2;
      up(piVar2,piVar2,iVar4,iVar3,pl);
      b = src_local;
      iVar3 = maxopp_local;
      piVar2 = local_60;
      *(undefined8 *)((long)aiStack_68 + lVar1 + -8) = 0x2205c5;
      bVar5 = pm_less(piVar2,b,iVar3,pl);
      if (bVar5) {
        for (local_50 = 0; local_50 < maxopp_local; local_50 = local_50 + 1) {
          src_local[local_50] = local_60[local_50];
        }
      }
      for (local_54 = 0; local_54 < maxopp_local; local_54 = local_54 + 1) {
        if (src_local[local_54] != _k_local[local_54]) {
          return true;
        }
      }
      dst_local._7_1_ = false;
    }
    else {
      dst_local._7_1_ = true;
    }
  }
  return dst_local._7_1_;
}

Assistant:

static bool
au(int *dst, int *src, int d, int k, int max, int maxopp, int pl)
{
    // first compute normal update
    int j = up(dst, src, d, k, pl);
    if (j == -1) return false; // no difference, already smallest...

    // then compute antagonistic update and update the antagonistic measure
    int tmp[k];
    if (!bump(tmp, src, k, max, maxopp, pl)) return true; // no bump possible; but dst != src so return true
    up(tmp, tmp, d, k, pl);

    // use smallest updated measure
    if (pm_less(tmp, dst, k, pl)) {
        for (int i=0; i<k; i++) dst[i] = tmp[i];
    }

    // finally, check if different
    for (int i=0; i<k; i++) if (dst[i] != src[i]) return true;
    return false;
}